

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
* __thiscall
Jinx::Impl::Script::WalkSubscripts
          (pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
           *__return_storage_ptr__,Script *this,uint32_t subscripts,CollectionPtr *collection)

{
  pointer pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
  *this_00;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  iterator iVar5;
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
  *ppVar6;
  ulong uVar7;
  Variant *pVVar8;
  ulong uVar9;
  Variant key;
  Variant newColl;
  value_type var;
  undefined1 local_119;
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
  *local_118;
  Variant local_110;
  CollectionPtr *local_e8;
  ulong local_e0;
  undefined1 local_d8 [8];
  anon_union_32_12_f16a26ea_for_Variant_1 aStack_d0;
  element_type *local_b0 [6];
  Variant local_80;
  Variant local_58;
  
  local_110.m_type = Null;
  local_118 = __return_storage_ptr__;
  if (subscripts != 0) {
    local_e0 = (ulong)(subscripts - 1);
    uVar7 = (ulong)subscripts;
    uVar9 = 0;
    local_e8 = collection;
    do {
      pVVar1 = (this->m_stack).
               super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar8 = pVVar1 + (((ulong)((long)(this->m_stack).
                                        super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1)
                         >> 3) * -0x3333333333333333 - (uVar7 & 0xffffffff));
      if (&local_110 != pVVar8) {
        Variant::Destroy(&local_110);
        Variant::Copy(&local_110,pVVar8);
      }
      if ((3 < local_110.m_type - Number) && (local_110.m_type != Guid)) {
        Error(this,"Invalid key type");
LAB_001f6a5f:
        (local_118->first).
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (local_118->first).
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (local_118->second).m_type = Null;
        ppVar6 = local_118;
        goto LAB_001f6a71;
      }
      if (uVar9 < local_e0) {
        iVar5 = std::
                _Rb_tree<Jinx::Variant,_std::pair<const_Jinx::Variant,_Jinx::Variant>,_std::_Select1st<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                ::find(&((collection->
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->_M_t,&local_110);
        if ((_Rb_tree_header *)iVar5._M_node ==
            &(((collection->
               super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
          local_d8 = (undefined1  [8])0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>,Jinx::Allocator<std::map<Jinx::Variant,Jinx::Variant,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_d0.m_string,
                     (map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                      **)local_d8,
                     (Allocator<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                      *)&local_119);
          Variant::Variant(&local_80,(CollectionPtr *)local_d8);
          if (aStack_d0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       aStack_d0.m_collection.
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
          this_00 = (_Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                     *)(collection->
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
          std::pair<Jinx::Variant,_Jinx::Variant>::pair<Jinx::Variant_&,_Jinx::Variant_&,_true>
                    ((pair<Jinx::Variant,_Jinx::Variant> *)local_d8,&local_110,&local_80);
          std::
          _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
          ::_M_emplace_unique<std::pair<Jinx::Variant,Jinx::Variant>>
                    (this_00,(pair<Jinx::Variant,_Jinx::Variant> *)local_d8);
          Variant::Destroy((Variant *)local_b0);
          Variant::Destroy((Variant *)local_d8);
          Variant::GetCollection((Variant *)local_d8);
          uVar4 = aStack_d0.m_number;
          auVar3 = local_d8;
          collection = local_e8;
          local_d8 = (undefined1  [8])0x0;
          aStack_d0.m_number = 0.0;
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_e8->
                   super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          (local_e8->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = (element_type *)auVar3;
          (local_e8->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (aStack_d0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       aStack_d0.m_collection.
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
          Variant::Destroy(&local_80);
        }
        else {
          if (*(int *)&iVar5._M_node[2]._M_parent != 5) {
            Error(this,"Expected collection when accessing by key");
            goto LAB_001f6a5f;
          }
          Variant::GetCollection((Variant *)local_d8);
          uVar4 = aStack_d0.m_collection.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
          auVar3 = local_d8;
          local_d8 = (undefined1  [8])0x0;
          aStack_d0.m_number = 0.0;
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (collection->
                   super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = (element_type *)auVar3;
          (collection->
          super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
          )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (aStack_d0._0_8_ != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       aStack_d0.m_collection.
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
        }
      }
      uVar9 = uVar9 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    do {
      pVVar1 = (this->m_stack).
               super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_stack).
          super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
          _M_impl.super__Vector_impl_data._M_start == pVVar1) {
        Error(this,"Stack underflow");
        local_58.m_type = Null;
      }
      else {
        Variant::Copy(&local_58,pVVar1 + -1);
        pVVar8 = (this->m_stack).
                 super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        (this->m_stack).
        super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
        _M_impl.super__Vector_impl_data._M_finish = pVVar8;
        Variant::Destroy(pVVar8);
      }
      Variant::Destroy(&local_58);
      subscripts = subscripts - 1;
    } while (subscripts != 0);
  }
  ppVar6 = local_118;
  std::
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
  ::
  pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_&,_Jinx::Variant_&,_true>
            (local_118,collection,&local_110);
LAB_001f6a71:
  Variant::Destroy(&local_110);
  return ppVar6;
}

Assistant:

inline std::pair<CollectionPtr, Variant> Script::WalkSubscripts(uint32_t subscripts, CollectionPtr collection)
	{
		// Walk up through subsequent subscript operators, then pops the keys off the stack and 
		// returns the final collection and key pair,
		Variant key;

		// Loop through the number of subscript operations used
		for (uint32_t i = 0; i < subscripts; ++i)
		{
			// Grab the appropriate key in the stack for this subscript 
			size_t index = m_stack.size() - (subscripts - i);
			key = m_stack[index];
			if (!key.IsKeyType())
			{
				Error("Invalid key type");
				return {};
			}

			// We only need to retrieve a new collection and key set if
			// this isn't the last operation.
			if (i < (subscripts - 1))
			{
				auto itr = collection->find(key);
				if (itr == collection->end())
				{
					Variant newColl = CreateCollection();
					collection->insert(std::make_pair(key, newColl));
					collection = newColl.GetCollection();
				}
				else if (itr->second.IsCollection())
				{
					collection = itr->second.GetCollection();
				}
				else
				{
					Error("Expected collection when accessing by key");
					return {};
				}
			}
		}

		// Pop keys off the stack
		for (uint32_t i = 0; i < subscripts; ++i)
			Pop();

		// Return the final collection and key pair
		return std::make_pair(collection, key);
	}